

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Matrix<tcu::Interval,_4,_3> * __thiscall
tcu::Matrix<tcu::Interval,_4,_3>::operator=
          (Matrix<tcu::Interval,_4,_3> *this,Matrix<tcu::Interval,_4,_3> *src)

{
  bool *pbVar1;
  bool *pbVar2;
  double dVar3;
  Matrix<tcu::Interval,_4,_3> *pMVar4;
  int row;
  long lVar5;
  long lVar6;
  
  pMVar4 = this;
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    for (lVar6 = 0; lVar6 != 0x120; lVar6 = lVar6 + 0x60) {
      *(undefined8 *)((long)&((Interval *)this)->m_hi + lVar6) =
           *(undefined8 *)((long)&((Interval *)src)->m_hi + lVar6);
      pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_4>,_3> *)&((Interval *)src)->m_hasNaN)->m_data
                [0].m_data[0].m_hasNaN + lVar6;
      dVar3 = *(double *)(pbVar1 + 8);
      pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_4>,_3> *)&((Interval *)this)->m_hasNaN)->m_data
                [0].m_data[0].m_hasNaN + lVar6;
      *(undefined8 *)pbVar2 = *(undefined8 *)pbVar1;
      *(double *)(pbVar2 + 8) = dVar3;
    }
    src = (Matrix<tcu::Interval,_4,_3> *)((long)src + 0x18);
    this = (Matrix<tcu::Interval,_4,_3> *)((long)this + 0x18);
  }
  return pMVar4;
}

Assistant:

Matrix<T, Rows, Cols>& Matrix<T, Rows, Cols>::operator= (const Matrix<T, Rows, Cols>& src)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = src(row, col);
	return *this;
}